

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O0

void __thiscall
QHttpNetworkConnectionChannel::closeAndResendCurrentRequest(QHttpNetworkConnectionChannel *this)

{
  QHttpNetworkConnection *pQVar1;
  int in_ESI;
  QHttpNetworkConnectionChannel *in_RDI;
  QHttpNetworkConnectionChannel *unaff_retaddr;
  QObject *in_stack_00000008;
  QHttpNetworkConnectionChannel *pQVar2;
  ConnectionType c;
  
  pQVar2 = in_RDI;
  requeueCurrentlyPipelinedRequests(unaff_retaddr);
  c = (ConnectionType)((ulong)pQVar2 >> 0x20);
  close(in_RDI,in_ESI);
  if (*(long *)(in_RDI + 0x38) != 0) {
    in_RDI[0x50] = (QHttpNetworkConnectionChannel)0x1;
  }
  QPointer::operator_cast_to_QHttpNetworkConnection_((QPointer<QHttpNetworkConnection> *)0x2f96dc);
  pQVar1 = qobject_cast<QHttpNetworkConnection*>((QObject *)0x2f96e4);
  if (pQVar1 != (QHttpNetworkConnection *)0x0) {
    QPointer::operator_cast_to_QHttpNetworkConnection_((QPointer<QHttpNetworkConnection> *)0x2f96fb)
    ;
    QMetaObject::invokeMethod<>(in_stack_00000008,(char *)unaff_retaddr,c);
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::closeAndResendCurrentRequest()
{
    requeueCurrentlyPipelinedRequests();
    close();
    if (reply)
        resendCurrent = true;
    if (qobject_cast<QHttpNetworkConnection*>(connection))
        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
}